

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo_FEA_loads_statics.cpp
# Opt level: O0

MyLoadCustomMultiple * __thiscall test_1::MyLoadCustomMultiple::Clone(MyLoadCustomMultiple *this)

{
  MyLoadCustomMultiple *this_00;
  MyLoadCustomMultiple *this_local;
  
  this_00 = (MyLoadCustomMultiple *)operator_new(0x68);
  MyLoadCustomMultiple(this_00,this);
  return this_00;
}

Assistant:

virtual MyLoadCustomMultiple* Clone() const override { return new MyLoadCustomMultiple(*this); }